

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffcpcl(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int create_col,int *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  double *pdVar7;
  LONGLONG value;
  int *status_00;
  size_t sVar8;
  size_t __nmemb;
  long lVar9;
  long lVar10;
  size_t sVar11;
  fitsfile *pfVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  int local_28c;
  int typecode;
  fitsfile *local_278;
  double *local_270;
  int anynull;
  int *local_260;
  char **local_258;
  char **local_250;
  char nulstr [2];
  double *local_240;
  ULONGLONG *local_238;
  double local_230;
  float *local_228;
  int tstatus;
  long repeat;
  int etypecode;
  undefined8 local_208;
  long width;
  long nrows;
  long local_1f0;
  long tfields;
  long outrows;
  char tform [71];
  long outloop;
  long inloop;
  long orepeat;
  char ttype [71];
  int otypecode;
  long owidth;
  
  nulstr[0] = '\x05';
  nulstr[1] = '\0';
  if (0 < *status) {
    return *status;
  }
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar4 = infptr->Fptr->hdutype;
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar2 = outfptr->Fptr->hdutype;
  if (iVar2 == 0 || iVar4 == 0) {
    ffpmsg("Can not copy columns to or from IMAGE HDUs (ffcpcl)");
    *status = 0xeb;
    return 0xeb;
  }
  if (iVar2 == 1 && iVar4 == 2) {
    ffpmsg("Copying from Binary table to ASCII table is not supported (ffcpcl)");
    *status = 0xe3;
    return 0xe3;
  }
  local_208 = CONCAT44(local_208._4_4_,iVar4) ^ 2;
  local_278 = outfptr;
  local_260 = status;
  ffgtcl(infptr,incol,&typecode,&repeat,&width,status);
  status_00 = local_260;
  ffeqty(infptr,incol,&etypecode,(long *)0x0,(long *)0x0,local_260);
  pfVar12 = local_278;
  if (typecode < 0) {
    pcVar6 = "Variable-length columns are not supported (ffcpcl)";
LAB_001160dd:
    ffpmsg(pcVar6);
    *status_00 = 0x105;
    return 0x105;
  }
  local_28c = incol;
  if (create_col == 0) {
    ffgtcl(local_278,outcol,&otypecode,&orepeat,&owidth,status_00);
    if (orepeat != repeat) {
      pcVar6 = "Input and output vector columns must have same length (ffcpcl)";
      goto LAB_001160dd;
    }
  }
  else {
    tstatus = 0;
    ffkeyn("TTYPE",incol,(char *)&orepeat,&tstatus);
    ffgkys(infptr,(char *)&orepeat,ttype,(char *)&owidth,&tstatus);
    ffkeyn("TFORM",incol,(char *)&orepeat,&tstatus);
    iVar3 = ffgkys(infptr,(char *)&orepeat,tform,(char *)&otypecode,&tstatus);
    status_00 = local_260;
    if (iVar3 != 0) {
      ffpmsg("Could not find TTYPE and TFORM keywords in input table (ffcpcl)");
      *local_260 = 0xe8;
      return 0xe8;
    }
    if (iVar2 == 2 && iVar4 == 1) {
      if (typecode < 0x29) {
        if (typecode == 0x10) {
          ffnkey((int)width,"A",tform,local_260);
        }
        else if (typecode == 0x15) {
          tform[2] = '\0';
          tform[0] = '1';
          tform[1] = 'I';
        }
      }
      else if (typecode == 0x29) {
        tform[2] = '\0';
        tform[0] = '1';
        tform[1] = 'J';
      }
      else if (typecode == 0x2a) {
        tform[2] = '\0';
        tform[0] = '1';
        tform[1] = 'E';
      }
      else if (typecode == 0x52) {
        tform[2] = '\0';
        tform[0] = '1';
        tform[1] = 'D';
      }
    }
    pfVar12 = local_278;
    iVar3 = ffgkyj(local_278,"TFIELDS",&tfields,(char *)0x0,&tstatus);
    if (iVar3 != 0) {
      ffpmsg("Could not read TFIELDS keyword in output table (ffcpcl)");
      *status_00 = 0xe6;
      return 0xe6;
    }
    iVar3 = (int)tfields + 1;
    if (outcol <= (int)tfields + 1) {
      iVar3 = outcol;
    }
    outcol = iVar3;
    outrows = (long)tform;
    nrows = (long)ttype;
    fficls(pfVar12,outcol,1,(char **)&nrows,(char **)&outrows,status_00);
    if (0 < *status_00) {
      ffpmsg("Could not append new column to output file (ffcpcl)");
      goto LAB_00116960;
    }
    local_270 = (double *)CONCAT71(local_270._1_7_,iVar2 == 2 && iVar4 == 1);
    if (infptr->Fptr == pfVar12->Fptr) {
      local_28c = incol + (uint)(outcol <= incol && infptr->HDUposition == local_278->HDUposition);
    }
    tstatus = 0;
    ffkeyn("TTYPE",outcol,(char *)&orepeat,&tstatus);
    pfVar12 = local_278;
    ffmcom(local_278,(char *)&orepeat,(char *)&owidth,&tstatus);
    ffkeyn("TFORM",outcol,(char *)&orepeat,&tstatus);
    ffmcom(pfVar12,(char *)&orepeat,(char *)&otypecode,&tstatus);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TUNIT",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TSCAL",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TZERO",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TDISP",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TLMIN",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TLMAX",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TDIM",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCTYP",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCUNI",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCRVL",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCRPX",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCDLT",status_00);
    ffcpky(infptr,pfVar12,local_28c,outcol,"TCROT",status_00);
    if ((char)local_270 == '\0') {
      ffcpky(infptr,pfVar12,local_28c,outcol,"TNULL",status_00);
    }
    else if ((typecode == 0x29) || (typecode == 0x15)) {
      ffkeyn("TNULL",local_28c,(char *)&orepeat,&tstatus);
      iVar4 = ffgkys(infptr,(char *)&orepeat,ttype,(char *)0x0,&tstatus);
      if (iVar4 < 1) {
        ffkeyn("TNULL",outcol,(char *)&orepeat,&tstatus);
        if (typecode == 0x29) {
          value = -9999999;
        }
        else {
          value = -0x8000;
        }
        ffpkyj(local_278,(char *)&orepeat,value,"Null value",status_00);
      }
    }
    pfVar12 = local_278;
    iVar4 = ffrdef(local_278,status_00);
    if (iVar4 != 0) goto LAB_00116960;
  }
  local_260 = (int *)CONCAT44(local_260._4_4_,outcol);
  ffgkyj(infptr,"NAXIS2",&nrows,(char *)0x0,status_00);
  ffgkyj(pfVar12,"NAXIS2",&outrows,(char *)0x0,status_00);
  lVar13 = outrows;
  if (nrows < outrows) {
    lVar13 = nrows;
  }
  if (typecode == 1) {
    lVar10 = repeat + 0xe;
    if (-1 < repeat + 7) {
      lVar10 = repeat + 7;
    }
    repeat = lVar10 >> 3;
  }
  else {
    uVar1 = (uint)local_208 | typecode ^ 0x10U;
    local_208 = CONCAT44(local_208._4_4_,uVar1);
    if (uVar1 == 0) {
      repeat = repeat / CONCAT44(width._4_4_,(int)width);
    }
  }
  nrows = lVar13;
  ffgrsz(infptr,&inloop,status_00);
  ffgrsz(pfVar12,&outloop,status_00);
  lVar10 = nrows;
  lVar13 = repeat;
  if (inloop < outloop) {
    outloop = inloop;
  }
  lVar9 = 1;
  if (1 < outloop) {
    lVar9 = outloop / 2;
  }
  if (nrows <= lVar9) {
    lVar9 = nrows;
  }
  __nmemb = lVar9 * repeat;
  if (typecode < 0x53) {
    if (typecode == 0xe) {
      local_250 = (char **)calloc(__nmemb,1);
      if (local_250 == (char **)0x0) {
        pcVar6 = "malloc failed to get memory for logicals (ffcpcl)";
        local_250 = (char **)0x0;
        goto LAB_00116cc6;
      }
      local_258 = (char **)0x0;
LAB_00116519:
      local_270 = (double *)0x0;
LAB_00116522:
      local_228 = (float *)0x0;
      goto LAB_0011652b;
    }
    if (typecode != 0x10) {
LAB_001162bc:
      if (etypecode != 0x50 || typecode != 0x51) {
        bVar14 = typecode != 0x51;
        bVar15 = etypecode == 0x52;
        pdVar7 = (double *)calloc(__nmemb,8);
        if (bVar15 || bVar14) {
          if (pdVar7 == (double *)0x0) {
            pcVar6 = "malloc failed to get memory for doubles (ffcpcl)";
            goto LAB_00116cc6;
          }
          local_230 = -9.99991999e+31;
          local_240 = (double *)0x0;
          local_270 = pdVar7;
        }
        else {
          if (pdVar7 == (double *)0x0) {
            pcVar6 = "malloc failed to get memory for long long int (ffcpcl)";
LAB_00116cc6:
            ffpmsg(pcVar6);
            *status_00 = 0x6f;
            return 0x6f;
          }
          local_230 = 0.0;
          local_270 = (double *)0x0;
          local_240 = pdVar7;
        }
        local_228 = (float *)0x0;
        local_250 = (char **)0x0;
        local_258 = (char **)0x0;
        local_238 = (ULONGLONG *)0x0;
        goto LAB_00116542;
      }
      local_238 = (ULONGLONG *)calloc(__nmemb,8);
      if (local_238 == (ULONGLONG *)0x0) {
        pcVar6 = "malloc failed to get memory for unsigned long long int (ffcpcl)";
        goto LAB_00116cc6;
      }
      local_250 = (char **)0x0;
      local_258 = (char **)0x0;
      local_270 = (double *)0x0;
      local_228 = (float *)0x0;
      goto LAB_0011653d;
    }
    ppcVar5 = (char **)calloc(__nmemb,8);
    local_230 = 0.0;
    local_258 = ppcVar5;
    if ((long)__nmemb < 1) {
      local_250 = (char **)0x0;
      goto LAB_00116519;
    }
    local_1f0 = lVar10;
    local_250 = (char **)0x0;
    lVar10 = 0;
    do {
      pcVar6 = (char *)calloc(CONCAT44(width._4_4_,(int)width) + 1,1);
      ppcVar5[lVar10] = pcVar6;
      lVar10 = lVar10 + 1;
    } while (__nmemb - lVar10 != 0);
    local_270 = (double *)0x0;
    local_228 = (float *)0x0;
    local_240 = (double *)0x0;
    local_238 = (ULONGLONG *)0x0;
    lVar10 = local_1f0;
  }
  else {
    if (typecode != 0x53) {
      if (typecode != 0xa3) goto LAB_001162bc;
      pdVar7 = (double *)calloc(__nmemb * 2,8);
      if (pdVar7 == (double *)0x0) {
        pcVar6 = "malloc failed to get memory for dbl complex (ffcpcl)";
        goto LAB_00116cc6;
      }
      local_250 = (char **)0x0;
      local_258 = (char **)0x0;
      local_270 = pdVar7;
      goto LAB_00116522;
    }
    local_228 = (float *)calloc(__nmemb * 2,4);
    if (local_228 == (float *)0x0) {
      pcVar6 = "malloc failed to get memory for complex (ffcpcl)";
      goto LAB_00116cc6;
    }
    local_250 = (char **)0x0;
    local_258 = (char **)0x0;
    local_270 = (double *)0x0;
LAB_0011652b:
    local_238 = (ULONGLONG *)0x0;
LAB_0011653d:
    local_230 = 0.0;
    local_240 = (double *)0x0;
  }
LAB_00116542:
  sVar8 = lVar13 * lVar10;
  sVar11 = __nmemb;
  if ((long)sVar8 < (long)__nmemb) {
    sVar11 = sVar8;
  }
  if (sVar11 != 0) {
    lVar13 = 0;
    local_208 = __nmemb;
    do {
      lVar9 = lVar13 / repeat + 1;
      lVar10 = lVar13 % repeat + 1;
      if (typecode < 0x53) {
        if (typecode == 0xe) {
          ffgcl(infptr,local_28c,lVar9,lVar10,sVar11,(char *)local_250,status_00);
        }
        else if (typecode == 0x10) {
          ffgcvs(infptr,local_28c,lVar9,lVar10,sVar11,nulstr,local_258,&anynull,status_00);
        }
        else {
LAB_001165f5:
          if (etypecode == 0x50 && typecode == 0x51) {
            ffgcvujj(infptr,local_28c,lVar9,lVar10,sVar11,0,local_238,&anynull,status_00);
          }
          else if (etypecode == 0x52 || typecode != 0x51) {
            ffgcvd(infptr,local_28c,lVar9,lVar10,sVar11,local_230,local_270,&anynull,status_00);
          }
          else {
            ffgcvjj(infptr,local_28c,lVar9,lVar10,sVar11,0,(LONGLONG *)local_240,&anynull,status_00)
            ;
          }
        }
      }
      else if (typecode == 0x53) {
        ffgcvc(infptr,local_28c,lVar9,lVar10,sVar11,0.0,local_228,&anynull,status_00);
      }
      else {
        if (typecode != 0xa3) goto LAB_001165f5;
        ffgcvm(infptr,local_28c,lVar9,lVar10,sVar11,local_230,local_270,&anynull,status_00);
      }
      if (0 < *status_00) {
        pcVar6 = "Error reading input copy of column (ffcpcl)";
LAB_001168e7:
        __nmemb = local_208;
        ffpmsg(pcVar6);
        break;
      }
      if (typecode < 0x53) {
        if (typecode == 0xe) {
          ffpcnl(local_278,(int)local_260,lVar9,lVar10,sVar11,(char *)local_250,'\x02',status_00);
        }
        else if (typecode == 0x10) {
          if (anynull == 0) {
            ffpcls(local_278,(int)local_260,lVar9,lVar10,sVar11,local_258,status_00);
          }
          else {
            ffpcns(local_278,(int)local_260,lVar9,lVar10,sVar11,local_258,nulstr,status_00);
          }
        }
        else {
LAB_00116743:
          if (etypecode == 0x50 && typecode == 0x51) {
            ffpclujj(local_278,(int)local_260,lVar9,lVar10,sVar11,local_238,status_00);
          }
          else if (etypecode == 0x52 || typecode != 0x51) {
            if (anynull == 0) {
              ffpcld(local_278,(int)local_260,lVar9,lVar10,sVar11,local_270,status_00);
            }
            else {
              ffpcnd(local_278,(int)local_260,lVar9,lVar10,sVar11,local_270,local_230,status_00);
            }
          }
          else {
            ffpcljj(local_278,(int)local_260,lVar9,lVar10,sVar11,(LONGLONG *)local_240,status_00);
          }
        }
      }
      else if (typecode == 0x53) {
        ffpclc(local_278,(int)local_260,lVar9,lVar10,sVar11,local_228,status_00);
      }
      else {
        if (typecode != 0xa3) goto LAB_00116743;
        ffpclm(local_278,(int)local_260,lVar9,lVar10,sVar11,local_270,status_00);
      }
      if (0 < *status_00) {
        pcVar6 = "Error writing output copy of column (ffcpcl)";
        goto LAB_001168e7;
      }
      sVar8 = sVar8 - sVar11;
      lVar13 = lVar13 + sVar11;
      sVar11 = local_208;
      if ((long)sVar8 < (long)local_208) {
        sVar11 = sVar8;
      }
      __nmemb = local_208;
    } while (sVar11 != 0);
  }
  ppcVar5 = local_258;
  if (typecode == 0xe) {
LAB_00116929:
    free(local_250);
  }
  else if (typecode == 0x10) {
    if ((long)__nmemb < 1) {
      local_250 = local_258;
    }
    else {
      sVar11 = 0;
      do {
        free(ppcVar5[sVar11]);
        sVar11 = sVar11 + 1;
      } while (__nmemb != sVar11);
      local_250 = ppcVar5;
    }
    goto LAB_00116929;
  }
  if (local_238 != (ULONGLONG *)0x0) {
    free(local_238);
  }
  if (local_240 != (double *)0x0) {
    free(local_240);
  }
  if (local_270 != (double *)0x0) {
    free(local_270);
  }
LAB_00116960:
  return *status_00;
}

Assistant:

int ffcpcl(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of input column   */
           int outcol,          /* I - number for output column  */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy a column from infptr and insert it in the outfptr table.
*/
{
    int tstatus, colnum, typecode, otypecode, etypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    long long int *jjvalues = 0;
    unsigned long long int *ujjvalues = 0;

    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffcpcl)");
       return(*status = NOT_TABLE);
    }

    if ( inHduType == BINARY_TBL &&  outHduType == ASCII_TBL)
    {
       ffpmsg
       ("Copying from Binary table to ASCII table is not supported (ffcpcl)");
       return(*status = NOT_BTABLE);
    }

    /* get the datatype and vector repeat length of the column */
    ffgtcl(infptr, incol, &typecode, &repeat, &width, status);
    /* ... and equivalent type code */
    ffeqty(infptr, incol, &etypecode, 0,      0,      status);

    if (typecode < 0)
    {
        ffpmsg("Variable-length columns are not supported (ffcpcl)");
        return(*status = BAD_TFORM);
    }

    if (create_col)    /* insert new column in output table? */
    {
        tstatus = 0;
        ffkeyn("TTYPE", incol, keyname, &tstatus);
        ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);
        ffkeyn("TFORM", incol, keyname, &tstatus);
    
        if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
          ("Could not find TTYPE and TFORM keywords in input table (ffcpcl)");
          return(*status = NO_TFORM);
        }

        if (inHduType == ASCII_TBL && outHduType == BINARY_TBL)
        {
            /* convert from ASCII table to BINARY table format string */
            if (typecode == TSTRING)
                ffnkey(width, "A", tform, status);

            else if (typecode == TLONG)
                strcpy(tform, "1J");

            else if (typecode == TSHORT)
                strcpy(tform, "1I");

            else if (typecode == TFLOAT)
                strcpy(tform,"1E");

            else if (typecode == TDOUBLE)
                strcpy(tform,"1D");
        }

        if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
        {
           ffpmsg
           ("Could not read TFIELDS keyword in output table (ffcpcl)");
           return(*status = NO_TFIELDS);
        }

        colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

        /* create the empty column */
        if (fficol(outfptr, colnum, ttype, tform, status) > 0)
        {
           ffpmsg
           ("Could not append new column to output file (ffcpcl)");
           return(*status);
        }

        if ((infptr->Fptr == outfptr->Fptr)
           && (infptr->HDUposition == outfptr->HDUposition)
           && (colnum <= incol))  {
	       incol++;  /* the input column has been shifted over */
        }

        /* copy the comment strings from the input file for TTYPE and TFORM */
        tstatus = 0;
        ffkeyn("TTYPE", colnum, keyname, &tstatus);
        ffmcom(outfptr, keyname, ttype_comm, &tstatus);
        ffkeyn("TFORM", colnum, keyname, &tstatus);
        ffmcom(outfptr, keyname, tform_comm, &tstatus);

        /* copy other column-related keywords if they exist */

        ffcpky(infptr, outfptr, incol, colnum, "TUNIT", status);
        ffcpky(infptr, outfptr, incol, colnum, "TSCAL", status);
        ffcpky(infptr, outfptr, incol, colnum, "TZERO", status);
        ffcpky(infptr, outfptr, incol, colnum, "TDISP", status);
        ffcpky(infptr, outfptr, incol, colnum, "TLMIN", status);
        ffcpky(infptr, outfptr, incol, colnum, "TLMAX", status);
        ffcpky(infptr, outfptr, incol, colnum, "TDIM", status);

        /*  WCS keywords */
        ffcpky(infptr, outfptr, incol, colnum, "TCTYP", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCUNI", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCRVL", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCRPX", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCDLT", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCROT", status);

        if (inHduType == ASCII_TBL && outHduType == BINARY_TBL)
        {
            /* binary tables only have TNULLn keyword for integer columns */
            if (typecode == TLONG || typecode == TSHORT)
            {
                /* check if null string is defined; replace with integer */
                ffkeyn("TNULL", incol, keyname, &tstatus);
                if (ffgkys(infptr, keyname, ttype, 0, &tstatus) <= 0)
                {
                   ffkeyn("TNULL", colnum, keyname, &tstatus);
                   if (typecode == TLONG)
                      ffpkyj(outfptr, keyname, -9999999L, "Null value", status);
                   else
                      ffpkyj(outfptr, keyname, -32768L, "Null value", status);
                }
            }
        }
        else
        {
            ffcpky(infptr, outfptr, incol, colnum, "TNULL", status);
        }

        /* rescan header to recognize the new keywords */
        if (ffrdef(outfptr, status) )
            return(*status);
    }
    else
    {
        colnum = outcol;
        /* get the datatype and vector repeat length of the output column */
        ffgtcl(outfptr, outcol, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffcpcl)");
            return(*status = BAD_TFORM);
        }
    }

    ffgkyj(infptr,  "NAXIS2", &nrows,   0, status);  /* no. of input rows */
    ffgkyj(outfptr, "NAXIS2", &outrows, 0, status);  /* no. of output rows */
    nrows = minvalue(nrows, outrows);

    if (typecode == TBIT)
        repeat = (repeat + 7) / 8;  /* convert from bits to bytes */
    else if (typecode == TSTRING && inHduType == BINARY_TBL)
        repeat = repeat / width;  /* convert from chars to unit strings */

    /* get optimum number of rows to copy at one time */
    ffgrsz(infptr,  &inloop,  status);
    ffgrsz(outfptr, &outloop, status);

    /* adjust optimum number, since 2 tables are open at once */
    maxloop = minvalue(inloop, outloop); /* smallest of the 2 tables */
    maxloop = maxvalue(1, maxloop / 2);  /* at least 1 row */
    maxloop = minvalue(maxloop, nrows);  /* max = nrows to be copied */
    maxloop *= repeat;                   /* mult by no of elements in a row */

    /* allocate memory for arrays */
    if (typecode == TLOGICAL)
    {
       lvalues   = (char *) calloc(maxloop, sizeof(char) );
       if (!lvalues)
       {
         ffpmsg
         ("malloc failed to get memory for logicals (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    else if (typecode == TSTRING)
    {
       /* allocate array of pointers */
       strarray = (char **) calloc(maxloop, sizeof(strarray));

       /* allocate space for each string */
       for (ii = 0; ii < maxloop; ii++)
          strarray[ii] = (char *) calloc(width+1, sizeof(char));
    }
    else if (typecode == TCOMPLEX)
    {
       fvalues = (float *) calloc(maxloop * 2, sizeof(float) );
       if (!fvalues)
       {
         ffpmsg
         ("malloc failed to get memory for complex (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
       fnull = 0.;
    }
    else if (typecode == TDBLCOMPLEX)
    {
       dvalues = (double *) calloc(maxloop * 2, sizeof(double) );
       if (!dvalues)
       {
         ffpmsg
         ("malloc failed to get memory for dbl complex (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
       dnull = 0.;
    }
    /* These are unsigned long-long ints that are not rescaled to floating point numbers */
    else if (typecode == TLONGLONG && etypecode == TULONGLONG) {

       ujjvalues = (unsigned long long int *) calloc(maxloop, sizeof(unsigned long long int) );
       if (!ujjvalues)
       {
         ffpmsg
         ("malloc failed to get memory for unsigned long long int (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    /* These are long-long ints that are not rescaled to floating point numbers */
    else if (typecode == TLONGLONG && etypecode != TDOUBLE) {

       jjvalues = (long long int *) calloc(maxloop, sizeof(long long int) );
       if (!jjvalues)
       {
         ffpmsg
         ("malloc failed to get memory for long long int (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    else    /* other numerical datatype; read them all as doubles */
    {
       dvalues = (double *) calloc(maxloop, sizeof(double) );
       if (!dvalues)
       {
         ffpmsg
         ("malloc failed to get memory for doubles (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
         dnull = -9.99991999E31;  /* use an unlikely value for nulls */
    }

    npixels = nrows * repeat;          /* total no. of pixels to copy */
    ntodo = minvalue(npixels, maxloop);   /* no. to copy per iteration */
    ndone = 0;             /* total no. of pixels that have been copied */

    while (ntodo)      /* iterate through the table */
    {
        firstrow = ndone / repeat + 1;
        firstelem = ndone - ((firstrow - 1) * repeat) + 1;

        /* read from input table */
        if (typecode == TLOGICAL)
            ffgcl(infptr, incol, firstrow, firstelem, ntodo, 
                       lvalues, status);
        else if (typecode == TSTRING)
            ffgcvs(infptr, incol, firstrow, firstelem, ntodo,
                       nulstr, strarray, &anynull, status);

        else if (typecode == TCOMPLEX)  
            ffgcvc(infptr, incol, firstrow, firstelem, ntodo, fnull, 
                   fvalues, &anynull, status);

        else if (typecode == TDBLCOMPLEX)
            ffgcvm(infptr, incol, firstrow, firstelem, ntodo, dnull, 
                   dvalues, &anynull, status);

	/* Neither TULONGLONG nor TLONGLONG does null checking.  Whatever
	   null value is in input table is transferred to output table
	   without checking.  Since the TNULL value was copied, this
	   should preserve null values */
	else if (typecode == TLONGLONG && etypecode == TULONGLONG)
	  ffgcvujj(infptr, incol, firstrow, firstelem, ntodo, /*nulval*/ 0,
                   ujjvalues, &anynull, status);

	else if (typecode == TLONGLONG && etypecode != TDOUBLE) 
	  ffgcvjj(infptr, incol, firstrow, firstelem, ntodo, /*nulval*/ 0, 
                   jjvalues, &anynull, status);

        else       /* all numerical types */
            ffgcvd(infptr, incol, firstrow, firstelem, ntodo, dnull, 
                   dvalues, &anynull, status);

        if (*status > 0)
        {
            ffpmsg("Error reading input copy of column (ffcpcl)");
            break;
        }

        /* write to output table */
        if (typecode == TLOGICAL)
        {
            nullflag = 2;

            ffpcnl(outfptr, colnum, firstrow, firstelem, ntodo, 
                       lvalues, nullflag, status);

        }

        else if (typecode == TSTRING)
        {
            if (anynull)
                ffpcns(outfptr, colnum, firstrow, firstelem, ntodo,
                       strarray, nulstr, status);
            else
                ffpcls(outfptr, colnum, firstrow, firstelem, ntodo,
                       strarray, status);
        }

        else if (typecode == TCOMPLEX)  
        {                      /* doesn't support writing nulls */
            ffpclc(outfptr, colnum, firstrow, firstelem, ntodo, 
                       fvalues, status);
        }

        else if (typecode == TDBLCOMPLEX)  
        {                      /* doesn't support writing nulls */
            ffpclm(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, status);
        }

	else if (typecode == TLONGLONG && etypecode == TULONGLONG)
	{   /* No null checking because we did none to read */
            ffpclujj(outfptr, colnum, firstrow, firstelem, ntodo, 
		     ujjvalues, status);
	}
	else if (typecode == TLONGLONG && etypecode != TDOUBLE) 
	{   /* No null checking because we did none to read */
	    ffpcljj(outfptr, colnum, firstrow, firstelem, ntodo, 
		    jjvalues, status);
	}
        else  /* all other numerical types */
        {
            if (anynull)
                ffpcnd(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, dnull, status);
            else
                ffpcld(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, status);
        }

        if (*status > 0)
        {
            ffpmsg("Error writing output copy of column (ffcpcl)");
            break;
        }

        npixels -= ntodo;
        ndone += ntodo;
        ntodo = minvalue(npixels, maxloop);
    }

    /* free the previously allocated memory */
    if (typecode == TLOGICAL)
    {
        free(lvalues);
    }
    else if (typecode == TSTRING)
    {
         for (ii = 0; ii < maxloop; ii++)
             free(strarray[ii]);

         free(strarray);
    }
    if (ujjvalues) free(ujjvalues);
    if (jjvalues)  free(jjvalues);
    if (dvalues)   free(dvalues);

    return(*status);
}